

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  pointer pcVar5;
  string *psVar6;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  pointer this_01;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *this_02;
  const_reference ppcVar9;
  allocator<char> local_529;
  string local_528;
  byte local_503;
  byte local_502;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  cmMakefile *local_4b8;
  cmMakefile *mf;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  cmake *local_3e8;
  unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> local_3e0;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  undefined1 local_3a8 [8];
  string message_3;
  string local_380;
  string *local_360;
  string *tsName;
  string local_350;
  allocator<char> local_329;
  undefined1 local_328 [8];
  string message_2;
  string local_300;
  string *local_2e0;
  string *platformName;
  string local_2d0;
  allocator<char> local_2a9;
  undefined1 local_2a8 [8];
  string message_1;
  string local_280;
  string *local_260;
  string *instance;
  allocator<char> local_231;
  string local_230;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0 [39];
  allocator<char> local_179;
  undefined1 local_178 [8];
  string message;
  string local_150;
  string *local_130;
  string *genName;
  string local_120;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string fullName;
  string local_b0;
  string *local_90;
  string *extraGenName;
  string local_80;
  string *local_60;
  string *genName_1;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  cmake *pcStack_18;
  int res;
  cmake *this_local;
  
  pcStack_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  local_1c = DoPreConfigureChecks(this);
  if (local_1c < 0) {
    this_local._4_4_ = -2;
  }
  else {
    if (local_1c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_HOME_DIRECTORY",&local_41);
      GetHomeDirectory_abi_cxx11_(this);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_40,pcVar4,
                    "Source directory with the top level CMakeLists.txt file for this project",4);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_GENERATOR",(allocator<char> *)((long)&extraGenName + 7))
      ;
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName + 7));
      local_60 = psVar6;
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_EXTRA_GENERATOR",
                 (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      psVar7 = cmState::GetInitializedCacheValue(pcVar5,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      psVar6 = local_60;
      local_90 = psVar7;
      if (local_60 != (string *)0x0) {
        local_fa = 0;
        if (psVar7 == (string *)0x0) {
          std::allocator<char>::allocator();
          local_fa = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
        }
        else {
          std::__cxx11::string::string((string *)&local_f8,(string *)psVar7);
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,psVar6,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if ((local_fa & 1) != 0) {
          std::allocator<char>::~allocator(&local_f9);
        }
        pcVar8 = CreateGlobalGenerator(this,(string *)local_d8);
        this->GlobalGenerator = pcVar8;
        std::__cxx11::string::~string((string *)local_d8);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        CreateDefaultGlobalGenerator(this);
      }
      else {
        bVar1 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
        cmSystemTools::SetForceUnixPaths(bVar1);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"Could not create generator",
                   (allocator<char> *)((long)&genName + 7));
        cmSystemTools::Error(&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&genName + 7));
        return -1;
      }
    }
    pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CMAKE_GENERATOR",
               (allocator<char> *)(message.field_2._M_local_buf + 0xf));
    psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
    local_130 = psVar6;
    if ((psVar6 == (string *)0x0) ||
       (uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[4])(this->GlobalGenerator,psVar6),
       (uVar3 & 1) != 0)) {
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"CMAKE_GENERATOR",&local_1c1);
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"CMAKE_GENERATOR",&local_1e9);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_210);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_1e8,pcVar4,"Name of generator.",4);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"CMAKE_EXTRA_GENERATOR",&local_231);
        cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
                  ((string *)&instance,this->GlobalGenerator);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_230,pcVar4,"Name of external makefile project generator.",4);
        std::__cxx11::string::~string((string *)&instance);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
      }
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"CMAKE_GENERATOR_INSTANCE",
                 (allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
      local_260 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"CMAKE_GENERATOR_INSTANCE",
                   (allocator<char> *)((long)&platformName + 7));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_2d0,pcVar4,"Generator instance identifier.",4);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&platformName + 7));
      }
      else if (((this->GeneratorInstanceSet & 1U) != 0) &&
              (bVar1 = std::operator!=(&this->GeneratorInstance,psVar6), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a8,"Error: generator instance: ",&local_2a9);
        std::allocator<char>::~allocator(&local_2a9);
        std::__cxx11::string::operator+=((string *)local_2a8,(string *)&this->GeneratorInstance);
        std::__cxx11::string::operator+=
                  ((string *)local_2a8,"\nDoes not match the instance used previously: ");
        std::__cxx11::string::operator+=((string *)local_2a8,(string *)local_260);
        std::__cxx11::string::operator+=
                  ((string *)local_2a8,
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        cmSystemTools::Error((string *)local_2a8);
        this_local._4_4_ = -2;
        std::__cxx11::string::~string((string *)local_2a8);
        return this_local._4_4_;
      }
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_GENERATOR_PLATFORM",
                 (allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
      local_2e0 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"CMAKE_GENERATOR_PLATFORM",
                   (allocator<char> *)((long)&tsName + 7));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_350,pcVar4,"Name of generator platform.",4);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tsName + 7));
      }
      else if (((this->GeneratorPlatformSet & 1U) != 0) &&
              (bVar1 = std::operator!=(&this->GeneratorPlatform,psVar6), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_328,"Error: generator platform: ",&local_329);
        std::allocator<char>::~allocator(&local_329);
        std::__cxx11::string::operator+=((string *)local_328,(string *)&this->GeneratorPlatform);
        std::__cxx11::string::operator+=
                  ((string *)local_328,"\nDoes not match the platform used previously: ");
        std::__cxx11::string::operator+=((string *)local_328,(string *)local_2e0);
        std::__cxx11::string::operator+=
                  ((string *)local_328,
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        cmSystemTools::Error((string *)local_328);
        this_local._4_4_ = -2;
        std::__cxx11::string::~string((string *)local_328);
        return this_local._4_4_;
      }
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator((allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
      local_360 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"CMAKE_GENERATOR_TOOLSET",&local_3d1);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        AddCacheEntry(this,&local_3d0,pcVar4,"Name of generator toolset.",4);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator(&local_3d1);
      }
      else if (((this->GeneratorToolsetSet & 1U) != 0) &&
              (bVar1 = std::operator!=(&this->GeneratorToolset,psVar6), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3a8,"Error: generator toolset: ",&local_3a9);
        std::allocator<char>::~allocator(&local_3a9);
        std::__cxx11::string::operator+=((string *)local_3a8,(string *)&this->GeneratorToolset);
        std::__cxx11::string::operator+=
                  ((string *)local_3a8,"\nDoes not match the toolset used previously: ");
        std::__cxx11::string::operator+=((string *)local_3a8,(string *)local_360);
        std::__cxx11::string::operator+=
                  ((string *)local_3a8,
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        cmSystemTools::Error((string *)local_3a8);
        this_local._4_4_ = -2;
        std::__cxx11::string::~string((string *)local_3a8);
        return this_local._4_4_;
      }
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      bVar1 = cmState::GetIsInTryCompile(pcVar5);
      if (!bVar1) {
        cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
        TruncateOutputLog(this,"CMakeOutput.log");
        TruncateOutputLog(this,"CMakeError.log");
      }
      local_3e8 = this;
      std::make_unique<cmFileAPI,cmake*>((cmake **)&local_3e0);
      std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator=
                (&this->FileAPI,&local_3e0);
      std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr(&local_3e0);
      this_01 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->
                          (&this->FileAPI);
      cmFileAPI::ReadQueries(this_01);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"CMAKE_BACKWARDS_COMPATIBILITY",&local_409);
      psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      if (psVar6 != (string *)0x0) {
        pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"LIBRARY_OUTPUT_PATH",&local_431);
        psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator(&local_431);
        if (psVar6 == (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,"LIBRARY_OUTPUT_PATH",&local_459);
          AddCacheEntry(this,&local_458,"","Single output directory for building all libraries.",1);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator(&local_459);
        }
        pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"EXECUTABLE_OUTPUT_PATH",&local_481);
        psVar6 = cmState::GetInitializedCacheValue(pcVar5,&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        if (psVar6 == (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a8,"EXECUTABLE_OUTPUT_PATH",
                     (allocator<char> *)((long)&mf + 7));
          AddCacheEntry(this,&local_4a8,"","Single output directory for building all executables.",1
                       );
          std::__cxx11::string::~string((string *)&local_4a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
        }
      }
      this_02 = cmGlobalGenerator::GetMakefiles(this->GlobalGenerator);
      ppcVar9 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](this_02,0);
      this_00 = *ppcVar9;
      local_4b8 = this_00;
      std::allocator<char>::allocator();
      local_502 = 0;
      local_503 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"CTEST_USE_LAUNCHERS",&local_4d9);
      bVar2 = cmMakefile::IsOn(this_00,&local_4d8);
      bVar1 = false;
      if (bVar2) {
        pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        local_502 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_500,"RULE_LAUNCH_COMPILE",&local_501);
        local_503 = 1;
        pcVar4 = cmState::GetGlobalProperty(pcVar5,&local_500);
        bVar1 = pcVar4 == (char *)0x0;
      }
      if ((local_503 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_500);
      }
      if ((local_502 & 1) != 0) {
        std::allocator<char>::~allocator(&local_501);
      }
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,
                   "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,&local_529);
        cmSystemTools::Error(&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        std::allocator<char>::~allocator(&local_529);
      }
      pcVar5 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
      cmState::SaveVerificationScript(pcVar5,psVar6);
      psVar6 = GetHomeOutputDirectory_abi_cxx11_(this);
      SaveCache(this,psVar6);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_178,"Error: generator : ",&local_179);
      std::allocator<char>::~allocator(&local_179);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1a0);
      std::__cxx11::string::operator+=((string *)local_178,local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::operator+=
                ((string *)local_178,"\nDoes not match the generator used previously: ");
      std::__cxx11::string::operator+=((string *)local_178,(string *)local_130);
      std::__cxx11::string::operator+=
                ((string *)local_178,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error((string *)local_178);
      this_local._4_4_ = -2;
      std::__cxx11::string::~string((string *)local_178);
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory().c_str(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const std::string* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const std::string* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const std::string* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += *genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const std::string* instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message = "Error: generator instance: ";
      message += this->GeneratorInstance;
      message += "\nDoes not match the instance used previously: ";
      message += *instance;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry(
      "CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance.c_str(),
      "Generator instance identifier.", cmStateEnums::INTERNAL);
  }

  if (const std::string* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += *platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const std::string* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += *tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}